

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encodetxb.c
# Opt level: O3

void av1_write_coeffs_txb
               (AV1_COMMON *cm,MACROBLOCK *x,aom_writer *w,int blk_row,int blk_col,int plane,
               int block,TX_SIZE tx_size)

{
  od_ec_enc *enc;
  tran_low_t *ptVar1;
  aom_cdf_prob (*paaVar2) [5];
  aom_cdf_prob (*icdf) [6];
  aom_cdf_prob (*icdf_00) [10];
  aom_cdf_prob (*icdf_01) [9];
  TX_CLASS tx_class;
  short sVar3;
  short sVar4;
  CB_COEFF_BUFFER *pCVar5;
  uint8_t *puVar6;
  FRAME_CONTEXT *pFVar7;
  MB_MODE_INFO *pMVar8;
  int16_t *scan;
  short sVar9;
  undefined1 auVar10 [14];
  undefined1 auVar11 [14];
  undefined1 auVar12 [14];
  undefined1 auVar13 [14];
  int iVar14;
  char *pcVar15;
  ulong uVar16;
  aom_cdf_prob *paVar17;
  byte bVar18;
  byte bVar19;
  uint uVar20;
  uint uVar21;
  int iVar22;
  ulong uVar23;
  ulong uVar24;
  ushort uVar25;
  ushort uVar26;
  int iVar27;
  long lVar28;
  uint uVar29;
  ulong uVar30;
  char cVar31;
  int iVar32;
  ulong uVar33;
  int iVar34;
  ulong uVar35;
  long lVar36;
  ulong uVar37;
  aom_cdf_prob (*icdf_02) [8];
  uint16_t *puVar38;
  aom_cdf_prob (*icdf_03) [11];
  int iVar39;
  aom_cdf_prob (*paaVar40) [3];
  ulong uVar41;
  bool bVar42;
  bool bVar43;
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  ushort uVar50;
  ushort uVar51;
  ushort uVar52;
  ushort uVar53;
  undefined1 auVar49 [16];
  uint uVar54;
  ushort uVar57;
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  uint8_t levels_buf [1312];
  int8_t coeff_contexts [4096];
  byte local_1558 [1312];
  int8_t local_1038 [4104];
  
  pCVar5 = x->cb_coef_buff;
  bVar43 = plane != 0;
  uVar23 = (ulong)bVar43;
  uVar35 = (ulong)(x->mbmi_ext_frame->cb_offset[uVar23] >> 4);
  uVar33 = (ulong)tx_size;
  lVar28 = (long)block;
  uVar26 = pCVar5->eobs[plane][uVar35 + lVar28];
  uVar30 = (ulong)uVar26;
  puVar6 = pCVar5->entropy_ctx[plane];
  uVar20 = (uint)""[uVar33] + (uint)""[uVar33] + 1 >> 1;
  uVar21 = uVar20 & 0xff;
  uVar41 = (ulong)uVar21;
  pFVar7 = (x->e_mbd).tile_ctx;
  paaVar40 = pFVar7->txb_skip_cdf[uVar41] + (puVar6[lVar28 + uVar35] & 0xf);
  enc = &w->ec;
  od_ec_encode_cdf_q15(enc,(uint)(uVar26 == 0),*paaVar40,2);
  if (w->allow_update_cdf != '\0') {
    uVar25 = (*paaVar40)[2];
    bVar18 = (char)(uVar25 >> 4) + 4;
    uVar50 = (*paaVar40)[0];
    if (uVar30 == 0) {
      sVar3 = (short)((int)(0x8000 - (uint)uVar50) >> (bVar18 & 0x1f));
    }
    else {
      sVar3 = -(uVar50 >> (bVar18 & 0x1f));
    }
    (*paaVar40)[0] = uVar50 + sVar3;
    (*paaVar40)[2] = uVar25 + (uVar25 < 0x20);
  }
  if (uVar30 == 0) {
    return;
  }
  pMVar8 = *(x->e_mbd).mi;
  if (((x->e_mbd).lossless[*(ushort *)&pMVar8->field_0xa7 & 7] == 0) &&
     ((0x61810UL >> (uVar33 & 0x3f) & 1) == 0)) {
    if (plane == 0) {
      bVar19 = (x->e_mbd).tx_type_map[blk_row * (x->e_mbd).tx_type_map_stride + blk_col];
LAB_001c34a4:
      bVar18 = bVar19;
      av1_write_tx_type(cm,&x->e_mbd,bVar18,tx_size,w);
    }
    else {
      cVar31 = (char)*(ushort *)&pMVar8->field_0xa7;
      if ((cVar31 < '\0') || ('\0' < pMVar8->ref_frame[0])) {
        bVar18 = (x->e_mbd).tx_type_map
                 [(blk_row << ((byte)(x->e_mbd).plane[uVar23].subsampling_y & 0x1f)) *
                  (x->e_mbd).tx_type_map_stride +
                  (blk_col << ((byte)(x->e_mbd).plane[uVar23].subsampling_x & 0x1f))];
        uVar29 = 1;
        if (-1 < cVar31) {
          uVar29 = (uint)('\0' < pMVar8->ref_frame[0]);
        }
      }
      else {
        bVar18 = intra_mode_to_tx_type__intra_mode_to_tx_type
                 [(byte)get_uv_mode_uv2y[pMVar8->uv_mode]];
        uVar29 = 0;
      }
      if ((0x18608UL >> (uVar33 & 0x3f) & 1) == 0) {
        if ((cm->features).reduced_tx_set_used == false) {
          uVar29 = (uint)av1_ext_tx_set_lookup[0]
                         [(ulong)((0x60604UL >> (uVar33 & 0x3f) & 1) != 0) + (ulong)(uVar29 * 2)];
        }
        else {
          uVar29 = (uint)(byte)((uVar29 == 0) + 1);
        }
      }
      if (*(int *)((long)av1_ext_tx_used[0] + (ulong)bVar18 * 4 + (ulong)(uVar29 << 6)) == 0) {
        bVar18 = 0;
      }
    }
  }
  else {
    bVar18 = 0;
    bVar19 = 0;
    if (plane == 0) goto LAB_001c34a4;
  }
  if (uVar26 < 0x21) {
    pcVar15 = "" + uVar30;
  }
  else {
    uVar29 = uVar26 - 1 >> 5;
    uVar16 = 0x10;
    if (uVar29 < 0x10) {
      uVar16 = (ulong)uVar29;
    }
    pcVar15 = "\x06\a\b\b\t\t\t\t\n\n\n\n\n\n\n\n\v" + uVar16;
  }
  iVar14 = (int)*pcVar15;
  sVar3 = av1_eob_group_start[iVar14];
  bVar42 = 9 < bVar18;
  uVar16 = (ulong)bVar42;
  iVar39 = iVar14 + -1;
  tx_class = ""[bVar18];
  cVar31 = (char)iVar39;
  switch(""[uVar33]) {
  case '\0':
    icdf = pFVar7->eob_flag_cdf16[uVar23] + uVar16;
    od_ec_encode_cdf_q15(enc,iVar39,*icdf,5);
    if (w->allow_update_cdf != '\0') {
      paVar17 = *icdf + 5;
      uVar25 = (*icdf)[5];
      bVar19 = (char)(uVar25 >> 4) + 5;
      lVar36 = 0;
      do {
        uVar50 = (*icdf)[lVar36];
        if (lVar36 < cVar31) {
          sVar4 = (short)((int)(0x8000 - (uint)uVar50) >> (bVar19 & 0x1f));
        }
        else {
          sVar4 = -(uVar50 >> (bVar19 & 0x1f));
        }
        (*icdf)[lVar36] = sVar4 + uVar50;
        lVar36 = lVar36 + 1;
      } while (lVar36 != 4);
LAB_001c3a9a:
      *paVar17 = *paVar17 + (ushort)(uVar25 < 0x20);
    }
    break;
  case '\x01':
    lVar36 = (ulong)bVar42 * 0x10 + uVar16 * -2 + uVar23 * 0x1c;
    puVar38 = (uint16_t *)((long)pFVar7 + lVar36 + 0x3f6);
    od_ec_encode_cdf_q15(enc,iVar39,puVar38,6);
    if (w->allow_update_cdf != '\0') {
      paVar17 = (aom_cdf_prob *)((long)pFVar7 + lVar36 + 0x402);
      uVar25 = *(ushort *)((long)pFVar7 + lVar36 + 0x402);
      bVar19 = (char)(uVar25 >> 4) + 5;
      lVar36 = 0;
      do {
        uVar50 = puVar38[lVar36];
        if (lVar36 < cVar31) {
          sVar4 = (short)((int)(0x8000 - (uint)uVar50) >> (bVar19 & 0x1f));
        }
        else {
          sVar4 = -(uVar50 >> (bVar19 & 0x1f));
        }
        puVar38[lVar36] = sVar4 + uVar50;
        lVar36 = lVar36 + 1;
      } while (lVar36 != 5);
      goto LAB_001c3a9a;
    }
    break;
  case '\x02':
    icdf_02 = pFVar7->eob_flag_cdf64[bVar43] + bVar42;
    od_ec_encode_cdf_q15(enc,iVar39,*icdf_02,7);
    if (w->allow_update_cdf != '\0') {
      paVar17 = pFVar7->eob_flag_cdf64[bVar43][bVar42] + 7;
      uVar25 = pFVar7->eob_flag_cdf64[bVar43][bVar42][7];
      bVar19 = (char)(uVar25 >> 4) + 5;
      lVar36 = 0;
      do {
        uVar50 = (*icdf_02)[lVar36];
        if (lVar36 < cVar31) {
          sVar4 = (short)((int)(0x8000 - (uint)uVar50) >> (bVar19 & 0x1f));
        }
        else {
          sVar4 = -(uVar50 >> (bVar19 & 0x1f));
        }
        (*icdf_02)[lVar36] = sVar4 + uVar50;
        lVar36 = lVar36 + 1;
      } while (lVar36 != 6);
      goto LAB_001c3a9a;
    }
    break;
  case '\x03':
    icdf_01 = pFVar7->eob_flag_cdf128[uVar23] + uVar16;
    od_ec_encode_cdf_q15(enc,iVar39,*icdf_01,8);
    if (w->allow_update_cdf != '\0') {
      paVar17 = *icdf_01 + 8;
      uVar25 = (*icdf_01)[8];
      bVar19 = (char)(uVar25 >> 4) + 5;
      lVar36 = 0;
      do {
        uVar50 = (*icdf_01)[lVar36];
        if (lVar36 < cVar31) {
          sVar4 = (short)((int)(0x8000 - (uint)uVar50) >> (bVar19 & 0x1f));
        }
        else {
          sVar4 = -(uVar50 >> (bVar19 & 0x1f));
        }
        (*icdf_01)[lVar36] = sVar4 + uVar50;
        lVar36 = lVar36 + 1;
      } while (lVar36 != 7);
      goto LAB_001c3a9a;
    }
    break;
  case '\x04':
    icdf_00 = pFVar7->eob_flag_cdf256[uVar23] + uVar16;
    od_ec_encode_cdf_q15(enc,iVar39,*icdf_00,9);
    if (w->allow_update_cdf != '\0') {
      paVar17 = *icdf_00 + 9;
      uVar25 = (*icdf_00)[9];
      auVar45._0_4_ = -(uint)('\x06' < cVar31);
      auVar45._4_4_ = -(uint)('\x06' < cVar31);
      auVar45._8_4_ = -(uint)('\a' < cVar31);
      auVar45._12_4_ = -(uint)('\a' < cVar31);
      uVar29 = (uVar25 >> 4) + 5;
      auVar56._0_4_ = -(uint)('\x04' < cVar31);
      auVar56._4_4_ = -(uint)('\x04' < cVar31);
      auVar56._8_4_ = -(uint)('\x05' < cVar31);
      auVar56._12_4_ = -(uint)('\x05' < cVar31);
      auVar45 = packssdw(auVar56,auVar45);
      auVar58._8_4_ = 0xffffffff;
      auVar58._0_8_ = 0xffffffffffffffff;
      auVar58._12_4_ = 0xffffffff;
      auVar47._0_4_ = -(uint)('\x02' < cVar31);
      auVar47._4_4_ = -(uint)('\x02' < cVar31);
      auVar47._8_4_ = -(uint)('\x03' < cVar31);
      auVar47._12_4_ = -(uint)('\x03' < cVar31);
      auVar44._0_4_ = -(uint)('\0' < cVar31);
      auVar44._4_4_ = -(uint)('\0' < cVar31);
      auVar44._8_4_ = -(uint)('\x01' < cVar31);
      auVar44._12_4_ = -(uint)('\x01' < cVar31);
      auVar44 = packssdw(auVar44,auVar47);
      auVar45 = packssdw(auVar44 ^ auVar58,auVar45 ^ auVar58);
      auVar44 = *(undefined1 (*) [16])*icdf_00;
      uVar50 = auVar44._8_2_;
      uVar51 = auVar44._10_2_;
      uVar52 = auVar44._12_2_;
      uVar53 = auVar44._14_2_;
      uVar57 = auVar44._6_2_;
      auVar10._10_2_ = 0;
      auVar10._0_10_ = auVar44._0_10_;
      auVar10._12_2_ = uVar57;
      auVar11._8_2_ = auVar44._4_2_;
      auVar11._0_8_ = auVar44._0_8_;
      auVar11._10_4_ = auVar10._10_4_;
      auVar13._6_8_ = 0;
      auVar13._0_6_ = auVar11._8_6_;
      auVar12._4_2_ = auVar44._2_2_;
      auVar12._0_4_ = auVar44._0_4_;
      auVar12._6_8_ = SUB148(auVar13 << 0x40,6);
      uVar54 = auVar44._0_4_ & 0xffff;
      auVar58 = ZEXT416(uVar29);
      uVar16 = (ulong)uVar29;
      auVar49._0_4_ = (int)(short)(uVar50 >> uVar16);
      auVar49._4_4_ = (int)(short)(uVar51 >> uVar16);
      auVar49._8_4_ = (int)(short)(uVar52 >> uVar16);
      auVar49._12_4_ = (int)(short)(uVar53 >> uVar16);
      auVar55._0_4_ = (int)(short)(uVar54 >> uVar16);
      auVar55._4_4_ = (int)(short)(auVar12._4_4_ >> uVar16);
      auVar55._8_4_ = (int)(short)(auVar11._8_4_ >> uVar16);
      auVar55._12_4_ = (int)(short)(uVar57 >> uVar16);
      auVar56 = packssdw(auVar55,auVar49);
      auVar59._0_4_ = (int)(short)((int)(0x8000 - (uint)uVar50) >> auVar58);
      auVar59._4_4_ = (int)(short)((int)(0x8000 - (uint)uVar51) >> auVar58);
      auVar59._8_4_ = (int)(short)((int)(0x8000 - (uint)uVar52) >> auVar58);
      auVar59._12_4_ = (int)(short)((int)(0x8000 - (uint)uVar53) >> auVar58);
      auVar48._0_4_ = (int)(short)((int)(0x8000 - uVar54) >> auVar58);
      auVar48._4_4_ = (int)(short)((int)(0x8000 - auVar12._4_4_) >> auVar58);
      auVar48._8_4_ = (int)(short)((int)(0x8000 - auVar11._8_4_) >> auVar58);
      auVar48._12_4_ = (int)(short)((int)(0x8000 - (uint)uVar57) >> auVar58);
      auVar58 = packssdw(auVar48,auVar59);
      auVar46._2_2_ = -auVar56._2_2_;
      auVar46._0_2_ = -auVar56._0_2_;
      auVar46._4_2_ = -auVar56._4_2_;
      auVar46._6_2_ = -auVar56._6_2_;
      auVar46._8_2_ = -auVar56._8_2_;
      auVar46._10_2_ = -auVar56._10_2_;
      auVar46._12_2_ = -auVar56._12_2_;
      auVar46._14_2_ = -auVar56._14_2_;
      auVar45 = ~auVar45 & auVar58 | auVar46 & auVar45;
      (*icdf_00)[0] = auVar45._0_2_ + auVar44._0_2_;
      (*icdf_00)[1] = auVar45._2_2_ + auVar44._2_2_;
      (*icdf_00)[2] = auVar45._4_2_ + auVar44._4_2_;
      (*icdf_00)[3] = auVar45._6_2_ + uVar57;
      (*icdf_00)[4] = auVar45._8_2_ + uVar50;
      (*icdf_00)[5] = auVar45._10_2_ + uVar51;
      (*icdf_00)[6] = auVar45._12_2_ + uVar52;
      (*icdf_00)[7] = auVar45._14_2_ + uVar53;
      goto LAB_001c3a9a;
    }
    break;
  case '\x05':
    icdf_03 = pFVar7->eob_flag_cdf512[uVar23] + uVar16;
    od_ec_encode_cdf_q15(enc,iVar39,*icdf_03,10);
    if (w->allow_update_cdf != '\0') {
      paVar17 = pFVar7->eob_flag_cdf512[uVar23][uVar16] + 10;
      uVar25 = pFVar7->eob_flag_cdf512[uVar23][uVar16][10];
      bVar19 = (char)(uVar25 >> 4) + 5;
      lVar36 = 0;
      do {
        uVar50 = (*icdf_03)[lVar36];
        if (lVar36 < cVar31) {
          sVar4 = (short)((int)(0x8000 - (uint)uVar50) >> (bVar19 & 0x1f));
        }
        else {
          sVar4 = -(uVar50 >> (bVar19 & 0x1f));
        }
        (*icdf_03)[lVar36] = sVar4 + uVar50;
        lVar36 = lVar36 + 1;
      } while (lVar36 != 9);
      goto LAB_001c3a9a;
    }
    break;
  default:
    uVar24 = (ulong)((uint)bVar43 * 0x30);
    puVar38 = (uint16_t *)((long)pFVar7->eob_flag_cdf1024[0][uVar16] + uVar24);
    od_ec_encode_cdf_q15(enc,iVar39,puVar38,0xb);
    if (w->allow_update_cdf != '\0') {
      paVar17 = (aom_cdf_prob *)((long)pFVar7->eob_flag_cdf1024[0][uVar16] + uVar24 + 0x16);
      uVar25 = *(ushort *)((long)pFVar7->eob_flag_cdf1024[0][uVar16] + uVar24 + 0x16);
      bVar19 = (char)(uVar25 >> 4) + 5;
      lVar36 = 0;
      do {
        uVar50 = puVar38[lVar36];
        if (lVar36 < cVar31) {
          sVar4 = (short)((int)(0x8000 - (uint)uVar50) >> (bVar19 & 0x1f));
        }
        else {
          sVar4 = -(uVar50 >> (bVar19 & 0x1f));
        }
        puVar38[lVar36] = sVar4 + uVar50;
        lVar36 = lVar36 + 1;
      } while (lVar36 != 10);
      goto LAB_001c3a9a;
    }
  }
  sVar4 = av1_eob_offset_bits[iVar14];
  iVar39 = (int)sVar4;
  if (0 < sVar4) {
    paaVar40 = pFVar7->eob_extra_cdf[uVar41 - 1][uVar23 + 1] + (long)iVar14 + 6;
    uVar29 = (uint)(((uint)uVar26 - (int)sVar3 >> (iVar39 - 1U & 0x1f) & 1) != 0);
    od_ec_encode_cdf_q15(enc,uVar29,*paaVar40,2);
    if (w->allow_update_cdf != '\0') {
      uVar25 = pFVar7->eob_extra_cdf[uVar41 - 1][uVar23 + 1][(long)iVar14 + 6][2];
      bVar19 = (char)(uVar25 >> 4) + 4;
      uVar50 = (*paaVar40)[0];
      if (uVar29 == 0) {
        sVar9 = -(uVar50 >> (bVar19 & 0x1f));
      }
      else {
        sVar9 = (short)((int)(0x8000 - (uint)uVar50) >> (bVar19 & 0x1f));
      }
      (*paaVar40)[0] = uVar50 + sVar9;
      pFVar7->eob_extra_cdf[uVar41 - 1][uVar23 + 1][(long)iVar14 + 6][2] = uVar25 + (uVar25 < 0x20);
    }
    if (sVar4 != 1) {
      iVar14 = 2;
      if (2 < iVar39) {
        iVar14 = iVar39;
      }
      iVar14 = iVar14 + -1;
      uVar29 = iVar39 - 2;
      do {
        od_ec_encode_bool_q15
                  (enc,(uint)(((uint)uVar26 - (int)sVar3 >> (uVar29 & 0x1f) & 1) != 0),0x4000);
        uVar29 = uVar29 - 1;
        iVar14 = iVar14 + -1;
      } while (iVar14 != 0);
    }
  }
  uVar16 = 10;
  if (tx_size < 0x11) {
    uVar24 = 3;
    if ((1 < tx_size - 0xb) && (tx_size != '\x04')) {
LAB_001c3bc6:
      uVar24 = uVar33;
    }
    iVar14 = tx_size_wide[uVar24];
    if (tx_size < 0x11) {
      uVar16 = 3;
      if ((1 < tx_size - 0xb) && (tx_size != '\x04')) {
LAB_001c3bfc:
        uVar16 = uVar33;
      }
    }
    else if (tx_size == '\x11') {
      uVar16 = 9;
    }
    else if (tx_size != '\x12') goto LAB_001c3bfc;
  }
  else {
    iVar14 = 0x20;
    if (tx_size != '\x12') {
      if (tx_size != '\x11') goto LAB_001c3bc6;
      uVar16 = 9;
      iVar14 = 0x10;
    }
  }
  ptVar1 = pCVar5->tcoeff[plane] + (ulong)x->mbmi_ext_frame->cb_offset[uVar23] + (long)(block << 4);
  (*av1_txb_init_levels)(ptVar1,iVar14,tx_size_high[uVar16],local_1558);
  scan = av1_scan_orders[tx_size][bVar18].scan;
  av1_get_nz_map_contexts_sse2(local_1558,scan,uVar26,tx_size,tx_class,local_1038);
  if (tx_size < 0x11) {
    uVar16 = 3;
    if ((tx_size - 0xb < 2) || (tx_size == '\x04')) goto LAB_001c3ce6;
  }
  else {
    if (tx_size == '\x11') {
      uVar16 = 9;
      goto LAB_001c3ce6;
    }
    if (tx_size == '\x12') {
      uVar16 = 10;
      goto LAB_001c3ce6;
    }
  }
  uVar16 = uVar33;
LAB_001c3ce6:
  uVar24 = (ulong)(uVar26 - 1);
  bVar18 = (byte)tx_size_high_log2[uVar16];
  iVar14 = 1 << (bVar18 & 0x1f);
  iVar39 = iVar14 + 4;
  uVar33 = uVar24;
  uVar16 = uVar41;
  if (2 < (byte)uVar20) {
    uVar16 = 3;
  }
  do {
    sVar3 = scan[uVar33];
    uVar20 = ptVar1[sVar3];
    uVar29 = -uVar20;
    if (0 < (int)uVar20) {
      uVar29 = uVar20;
    }
    uVar20 = 3;
    if (uVar29 < 3) {
      uVar20 = uVar29;
    }
    if (uVar33 == uVar24) {
      puVar38 = (uint16_t *)
                ((long)pFVar7->coeff_base_eob_cdf[0][bVar43][local_1038[sVar3]] +
                (ulong)(uVar21 << 6));
      od_ec_encode_cdf_q15(enc,uVar20 - 1,puVar38,3);
      if (w->allow_update_cdf != '\0') {
        paVar17 = puVar38 + 3;
        uVar26 = puVar38[3];
        bVar19 = (char)(uVar26 >> 4) + 4;
        lVar36 = 0;
        do {
          uVar25 = puVar38[lVar36];
          if (lVar36 < (char)(uVar20 - 1)) {
            sVar4 = (short)((int)(0x8000 - (uint)uVar25) >> (bVar19 & 0x1f));
          }
          else {
            sVar4 = -(uVar25 >> (bVar19 & 0x1f));
          }
          puVar38[lVar36] = sVar4 + uVar25;
          lVar36 = lVar36 + 1;
        } while (lVar36 != 2);
LAB_001c3ec7:
        *paVar17 = *paVar17 + (ushort)(uVar26 < 0x20);
      }
    }
    else {
      paaVar2 = pFVar7->coeff_base_cdf[uVar41][uVar23] + local_1038[sVar3];
      od_ec_encode_cdf_q15(enc,uVar20,*paaVar2,4);
      if (w->allow_update_cdf != '\0') {
        paVar17 = *paaVar2 + 4;
        uVar26 = (*paaVar2)[4];
        bVar19 = (char)(uVar26 >> 4) + 5;
        uVar37 = 0;
        do {
          uVar25 = (*paaVar2)[uVar37];
          if (uVar37 < uVar20) {
            sVar4 = (short)((int)(0x8000 - (uint)uVar25) >> (bVar19 & 0x1f));
          }
          else {
            sVar4 = -(uVar25 >> (bVar19 & 0x1f));
          }
          (*paaVar2)[uVar37] = sVar4 + uVar25;
          uVar37 = uVar37 + 1;
        } while (uVar37 != 3);
        goto LAB_001c3ec7;
      }
    }
    if (2 < uVar29) {
      iVar27 = (int)sVar3 >> (bVar18 & 0x1f);
      iVar32 = iVar27 << (bVar18 & 0x1f);
      iVar22 = sVar3 - iVar32;
      iVar34 = iVar27 * iVar39 + iVar22;
      lVar36 = (long)(iVar39 + iVar34);
      uVar20 = (uint)local_1558[lVar36] + (uint)local_1558[(long)iVar34 + 1];
      if (tx_class == '\x02') {
        uVar20 = uVar20 + local_1558[(long)iVar34 + 2] + 1 >> 1;
        if (5 < uVar20) {
          uVar20 = 6;
        }
        if (sVar3 != 0) {
          if (sVar3 != iVar32) goto LAB_001c3f7d;
LAB_001c3fa5:
          uVar20 = uVar20 + 7;
        }
      }
      else {
        if (tx_class == '\x01') {
          uVar20 = uVar20 + local_1558[iVar34 + iVar14 * 2 + 8] + 1 >> 1;
          if (5 < uVar20) {
            uVar20 = 6;
          }
          if (sVar3 == 0) goto LAB_001c3fa8;
          if (iVar27 == 0) goto LAB_001c3fa5;
        }
        else if (tx_class == '\0') {
          uVar20 = uVar20 + local_1558[lVar36 + 1] + 1 >> 1;
          if (5 < uVar20) {
            uVar20 = 6;
          }
          if (sVar3 == 0) goto LAB_001c3fa8;
          if ((iVar27 < 2) && (iVar22 < 2)) goto LAB_001c3fa5;
        }
LAB_001c3f7d:
        uVar20 = uVar20 + 0xe;
      }
LAB_001c3fa8:
      paaVar2 = pFVar7->coeff_br_cdf[uVar16][uVar23] + uVar20;
      uVar20 = 0;
      do {
        iVar27 = (uVar29 - 3) - uVar20;
        iVar22 = 3;
        if (iVar27 < 3) {
          iVar22 = iVar27;
        }
        od_ec_encode_cdf_q15(enc,iVar22,*paaVar2,4);
        if (w->allow_update_cdf != '\0') {
          uVar26 = (*paaVar2)[4];
          bVar19 = (char)(uVar26 >> 4) + 5;
          lVar36 = 0;
          do {
            uVar25 = (*paaVar2)[lVar36];
            if (lVar36 < (char)iVar22) {
              sVar3 = (short)((int)(0x8000 - (uint)uVar25) >> (bVar19 & 0x1f));
            }
            else {
              sVar3 = -(uVar25 >> (bVar19 & 0x1f));
            }
            (*paaVar2)[lVar36] = sVar3 + uVar25;
            lVar36 = lVar36 + 1;
          } while (lVar36 != 3);
          (*paaVar2)[4] = (*paaVar2)[4] + (ushort)(uVar26 < 0x20);
        }
      } while ((2 < iVar27) && (bVar42 = uVar20 < 9, uVar20 = uVar20 + 3, bVar42));
    }
    iVar22 = (int)uVar33;
    uVar33 = uVar33 - 1;
    if (iVar22 < 1) {
      uVar41 = 0;
      do {
        uVar20 = ptVar1[scan[uVar41]];
        uVar21 = -uVar20;
        if (0 < (int)uVar20) {
          uVar21 = uVar20;
        }
        if (uVar20 != 0) {
          if (uVar41 == 0) {
            paaVar40 = pFVar7->dc_sign_cdf[uVar23] + (puVar6[lVar28 + uVar35] >> 4 & 3);
            od_ec_encode_cdf_q15(enc,uVar20 >> 0x1f,*paaVar40,2);
            if (w->allow_update_cdf != '\0') {
              uVar26 = (*paaVar40)[2];
              bVar18 = (char)(uVar26 >> 4) + 4;
              uVar25 = (*paaVar40)[0];
              if ((int)uVar20 < 0) {
                sVar3 = (short)((int)(0x8000 - (uint)uVar25) >> (bVar18 & 0x1f));
              }
              else {
                sVar3 = -(uVar25 >> (bVar18 & 0x1f));
              }
              (*paaVar40)[0] = uVar25 + sVar3;
              (*paaVar40)[2] = uVar26 + (uVar26 < 0x20);
            }
          }
          else {
            od_ec_encode_bool_q15(enc,uVar20 >> 0x1f,0x4000);
          }
          if (0xe < uVar21) {
            uVar20 = uVar21 - 0xe >> 1;
            if (uVar20 == 0) {
              uVar29 = 0x20;
            }
            else {
              uVar29 = 0x1f;
              if (uVar20 != 0) {
                for (; uVar20 >> uVar29 == 0; uVar29 = uVar29 - 1) {
                }
              }
              uVar29 = uVar29 ^ 0x1f;
            }
            if (uVar21 != 0xf) {
              iVar14 = uVar29 - 0x20;
              do {
                od_ec_encode_bool_q15(enc,0,0x4000);
                iVar14 = iVar14 + 1;
              } while (iVar14 != 0);
            }
            uVar29 = 0x21 - uVar29;
            do {
              uVar29 = uVar29 - 1;
              od_ec_encode_bool_q15(enc,(uint)((uVar21 - 0xe >> (uVar29 & 0x1f) & 1) != 0),0x4000);
            } while (0 < (int)uVar29);
          }
        }
        uVar41 = uVar41 + 1;
      } while (uVar41 != uVar30);
      return;
    }
  } while( true );
}

Assistant:

void av1_write_coeffs_txb(const AV1_COMMON *const cm, MACROBLOCK *const x,
                          aom_writer *w, int blk_row, int blk_col, int plane,
                          int block, TX_SIZE tx_size) {
  MACROBLOCKD *xd = &x->e_mbd;
  const CB_COEFF_BUFFER *cb_coef_buff = x->cb_coef_buff;
  const PLANE_TYPE plane_type = get_plane_type(plane);
  const int txb_offset = x->mbmi_ext_frame->cb_offset[plane_type] /
                         (TX_SIZE_W_MIN * TX_SIZE_H_MIN);
  const uint16_t *eob_txb = cb_coef_buff->eobs[plane] + txb_offset;
  const uint16_t eob = eob_txb[block];
  const uint8_t *entropy_ctx = cb_coef_buff->entropy_ctx[plane] + txb_offset;
  const int txb_skip_ctx = entropy_ctx[block] & TXB_SKIP_CTX_MASK;
  const TX_SIZE txs_ctx = get_txsize_entropy_ctx(tx_size);
  FRAME_CONTEXT *ec_ctx = xd->tile_ctx;
  aom_write_symbol(w, eob == 0, ec_ctx->txb_skip_cdf[txs_ctx][txb_skip_ctx], 2);
  if (eob == 0) return;

  const TX_TYPE tx_type =
      av1_get_tx_type(xd, plane_type, blk_row, blk_col, tx_size,
                      cm->features.reduced_tx_set_used);
  // Only y plane's tx_type is transmitted
  if (plane == 0) {
    av1_write_tx_type(cm, xd, tx_type, tx_size, w);
  }

  int eob_extra;
  const int eob_pt = av1_get_eob_pos_token(eob, &eob_extra);
  const int eob_multi_size = txsize_log2_minus4[tx_size];
  const TX_CLASS tx_class = tx_type_to_class[tx_type];
  const int eob_multi_ctx = (tx_class == TX_CLASS_2D) ? 0 : 1;
  switch (eob_multi_size) {
    case 0:
      aom_write_symbol(w, eob_pt - 1,
                       ec_ctx->eob_flag_cdf16[plane_type][eob_multi_ctx], 5);
      break;
    case 1:
      aom_write_symbol(w, eob_pt - 1,
                       ec_ctx->eob_flag_cdf32[plane_type][eob_multi_ctx], 6);
      break;
    case 2:
      aom_write_symbol(w, eob_pt - 1,
                       ec_ctx->eob_flag_cdf64[plane_type][eob_multi_ctx], 7);
      break;
    case 3:
      aom_write_symbol(w, eob_pt - 1,
                       ec_ctx->eob_flag_cdf128[plane_type][eob_multi_ctx], 8);
      break;
    case 4:
      aom_write_symbol(w, eob_pt - 1,
                       ec_ctx->eob_flag_cdf256[plane_type][eob_multi_ctx], 9);
      break;
    case 5:
      aom_write_symbol(w, eob_pt - 1,
                       ec_ctx->eob_flag_cdf512[plane_type][eob_multi_ctx], 10);
      break;
    default:
      aom_write_symbol(w, eob_pt - 1,
                       ec_ctx->eob_flag_cdf1024[plane_type][eob_multi_ctx], 11);
      break;
  }

  const int eob_offset_bits = av1_eob_offset_bits[eob_pt];
  if (eob_offset_bits > 0) {
    const int eob_ctx = eob_pt - 3;
    int eob_shift = eob_offset_bits - 1;
    int bit = (eob_extra & (1 << eob_shift)) ? 1 : 0;
    aom_write_symbol(w, bit,
                     ec_ctx->eob_extra_cdf[txs_ctx][plane_type][eob_ctx], 2);
    for (int i = 1; i < eob_offset_bits; i++) {
      eob_shift = eob_offset_bits - 1 - i;
      bit = (eob_extra & (1 << eob_shift)) ? 1 : 0;
      aom_write_bit(w, bit);
    }
  }

  const int width = get_txb_wide(tx_size);
  const int height = get_txb_high(tx_size);
  uint8_t levels_buf[TX_PAD_2D];
  uint8_t *const levels = set_levels(levels_buf, height);
  const tran_low_t *tcoeff_txb =
      cb_coef_buff->tcoeff[plane] + x->mbmi_ext_frame->cb_offset[plane_type];
  const tran_low_t *tcoeff = tcoeff_txb + BLOCK_OFFSET(block);
  av1_txb_init_levels(tcoeff, width, height, levels);
  const SCAN_ORDER *const scan_order = get_scan(tx_size, tx_type);
  const int16_t *const scan = scan_order->scan;
  DECLARE_ALIGNED(16, int8_t, coeff_contexts[MAX_TX_SQUARE]);
  av1_get_nz_map_contexts(levels, scan, eob, tx_size, tx_class, coeff_contexts);

  const int bhl = get_txb_bhl(tx_size);
  for (int c = eob - 1; c >= 0; --c) {
    const int pos = scan[c];
    const int coeff_ctx = coeff_contexts[pos];
    const tran_low_t v = tcoeff[pos];
    const tran_low_t level = abs(v);

    if (c == eob - 1) {
      aom_write_symbol(
          w, AOMMIN(level, 3) - 1,
          ec_ctx->coeff_base_eob_cdf[txs_ctx][plane_type][coeff_ctx], 3);
    } else {
      aom_write_symbol(w, AOMMIN(level, 3),
                       ec_ctx->coeff_base_cdf[txs_ctx][plane_type][coeff_ctx],
                       4);
    }
    if (level > NUM_BASE_LEVELS) {
      // level is above 1.
      const int base_range = level - 1 - NUM_BASE_LEVELS;
      const int br_ctx = get_br_ctx(levels, pos, bhl, tx_class);
      aom_cdf_prob *cdf =
          ec_ctx->coeff_br_cdf[AOMMIN(txs_ctx, TX_32X32)][plane_type][br_ctx];
      for (int idx = 0; idx < COEFF_BASE_RANGE; idx += BR_CDF_SIZE - 1) {
        const int k = AOMMIN(base_range - idx, BR_CDF_SIZE - 1);
        aom_write_symbol(w, k, cdf, BR_CDF_SIZE);
        if (k < BR_CDF_SIZE - 1) break;
      }
    }
  }

  // Loop to code all signs in the transform block,
  // starting with the sign of DC (if applicable)
  for (int c = 0; c < eob; ++c) {
    const tran_low_t v = tcoeff[scan[c]];
    const tran_low_t level = abs(v);
    const int sign = (v < 0) ? 1 : 0;
    if (level) {
      if (c == 0) {
        const int dc_sign_ctx =
            (entropy_ctx[block] >> DC_SIGN_CTX_SHIFT) & DC_SIGN_CTX_MASK;
        aom_write_symbol(w, sign, ec_ctx->dc_sign_cdf[plane_type][dc_sign_ctx],
                         2);
      } else {
        aom_write_bit(w, sign);
      }
      if (level > COEFF_BASE_RANGE + NUM_BASE_LEVELS)
        write_golomb(w, level - COEFF_BASE_RANGE - 1 - NUM_BASE_LEVELS);
    }
  }
}